

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2plus.hpp
# Opt level: O3

bool trng::operator==(status_type *a,status_type *b)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  if (a->index == b->index) {
    uVar1 = int_math::ceil2<unsigned_int>(0x209);
    if (uVar1 == 0) {
      bVar3 = true;
    }
    else {
      uVar2 = 0;
      do {
        bVar3 = a->r[uVar2] == b->r[uVar2];
        if (!bVar3) {
          return bVar3;
        }
        uVar2 = uVar2 + 1;
        uVar1 = int_math::ceil2<unsigned_int>(0x209);
      } while (uVar2 < uVar1);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator==(const status_type &a, const status_type &b) {
        if (a.index != b.index)
          return false;
        for (unsigned int i{0}; i < a.size(); ++i)
          if (a.r[i] != b.r[i])
            return false;
        return true;
      }